

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O2

ExprPtr __thiscall mathiu::impl::operator<(impl *this,ExprPtr *lhs,ExprPtr *rhs)

{
  double dVar1;
  tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  *ptVar2;
  bool bVar3;
  enable_if_t<isTupleLikeV<std::tuple<const_std::shared_ptr<const_mathiu::impl::Expr>_&,_const_std::shared_ptr<const_mathiu::impl::Expr>_&>_>,_bool>
  eVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  undefined1 *puVar6;
  ExprPtr EVar7;
  __shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> local_a8;
  double local_90;
  undefined1 local_88 [32];
  ExprPtr *local_68;
  ExprPtr *local_60;
  tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  local_58;
  tuple<const_std::shared_ptr<const_mathiu::impl::Expr>_&,_const_std::shared_ptr<const_mathiu::impl::Expr>_&>
  local_30;
  
  bVar3 = equal(lhs,rhs);
  if (bVar3) {
    std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)false_);
    _Var5._M_pi = extraout_RDX;
  }
  else {
    local_a8._M_ptr = (element_type *)0x0;
    local_a8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68 = lhs;
    local_60 = rhs;
    local_30.
    super__Tuple_impl<0UL,_const_std::shared_ptr<const_mathiu::impl::Expr>_&,_const_std::shared_ptr<const_mathiu::impl::Expr>_&>
    .super__Tuple_impl<1UL,_const_std::shared_ptr<const_mathiu::impl::Expr>_&>.
    super__Head_base<1UL,_const_std::shared_ptr<const_mathiu::impl::Expr>_&,_false>._M_head_impl =
         (_Head_base<1UL,_const_std::shared_ptr<const_mathiu::impl::Expr>_&,_false>)
         (_Head_base<1UL,_const_std::shared_ptr<const_mathiu::impl::Expr>_&,_false>)rhs;
    local_30.
    super__Tuple_impl<0UL,_const_std::shared_ptr<const_mathiu::impl::Expr>_&,_const_std::shared_ptr<const_mathiu::impl::Expr>_&>
    .super__Head_base<0UL,_const_std::shared_ptr<const_mathiu::impl::Expr>_&,_false>._M_head_impl =
         lhs;
    eVar4 = matchit::impl::
            PatternTraits<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::{lambda(auto:1&&)#1}>,matchit::impl::Meet<mathiu::impl::asDouble::{lambda(auto:1&&)#1}>>>
            ::
            matchPatternImpl<std::tuple<std::shared_ptr<mathiu::impl::Expr_const>const&,std::shared_ptr<mathiu::impl::Expr_const>const&>,matchit::impl::Context<>>
                      (&local_30,
                       (Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>_>
                        *)(local_88 + 0x18),0,(Context<> *)local_88);
    if (eVar4) {
      local_90 = evald(local_68);
      dVar1 = evald(local_60);
      puVar6 = false_;
      if (local_90 < dVar1) {
        puVar6 = true_;
      }
      std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)&local_58,
                 (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)puVar6);
      std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_a8,
                 (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
      ptVar2 = &local_58;
    }
    else {
      local_88._20_4_ = 1;
      std::
      tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
      ::
      tuple<mathiu::impl::RelationalKind,_const_std::shared_ptr<const_mathiu::impl::Expr>_&,_const_std::shared_ptr<const_mathiu::impl::Expr>_&,_true,_true>
                (&local_58,(RelationalKind *)(local_88 + 0x14),lhs,rhs);
      std::
      make_shared<mathiu::impl::Expr_const,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>
                ((tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                  *)local_88);
      std::
      _Tuple_impl<1UL,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
      ::~_Tuple_impl((_Tuple_impl<1UL,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                      *)&local_58);
      std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_a8,
                 (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)local_88);
      ptVar2 = (tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                *)local_88;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(ptVar2->
                       super__Tuple_impl<0UL,_mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                       ).
                       super__Tuple_impl<1UL,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                       .super__Tuple_impl<2UL,_std::shared_ptr<const_mathiu::impl::Expr>_>.
                       super__Head_base<2UL,_std::shared_ptr<const_mathiu::impl::Expr>,_false> + 8))
    ;
    _Var5._M_pi = local_a8._M_refcount._M_pi;
    local_a8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)this = local_a8._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var5._M_pi;
    local_a8._M_ptr = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
    _Var5._M_pi = extraout_RDX_00;
  }
  EVar7.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  EVar7.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar7.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr operator<(ExprPtr const &lhs, ExprPtr const &rhs)
    {
        if (equal(lhs, rhs))
        {
            return false_;
        }
        return match(lhs, rhs)(
            pattern | ds(asDouble, asDouble) = [&]
            { return evald(lhs) < evald(rhs) ? true_ : false_; },
            pattern | _ = [&]
            { return makeSharedExprPtr(Relational{RelationalKind::kLESS, lhs, rhs}); });
    }